

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco_Apu.cpp
# Opt level: O1

void __thiscall Nes_Namco_Apu::run_until(Nes_Namco_Apu *this,blip_time_t nes_end_time)

{
  Namco_Osc *pNVar1;
  byte bVar2;
  byte bVar3;
  blip_ulong bVar4;
  Blip_Buffer *pBVar5;
  buf_t_ *pbVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  
  uVar12 = this->reg[0x7f] >> 4 & 7;
  iVar7 = uVar12 + 1;
  uVar13 = (ulong)uVar12 ^ 7;
  do {
    pBVar5 = this->oscs[uVar13].output;
    if (pBVar5 != (Blip_Buffer *)0x0) {
      pNVar1 = this->oscs + uVar13;
      pBVar5->modified_ = 1;
      bVar4 = pBVar5->factor_;
      uVar12 = this->last_time * bVar4 + pBVar5->offset_ + pNVar1->delay;
      uVar17 = bVar4 * nes_end_time + pBVar5->offset_;
      pNVar1->delay = 0;
      if (uVar12 < uVar17) {
        bVar2 = (byte)(this->synth).impulses[uVar13 * 4 + -0x32];
        if ((bVar2 < 0x20) ||
           (bVar3 = *(byte *)((long)(this->synth).impulses + uVar13 * 8 + -0x61), (bVar3 & 0xf) == 0
           )) {
          bVar18 = false;
        }
        else {
          uVar11 = (uint)this->reg[uVar13 * 8 + 0x40] |
                   (uint)(byte)(this->synth).impulses[uVar13 * 4 + -0x33] << 8 | (bVar2 & 3) << 0x10
          ;
          bVar18 = (uint)(iVar7 * 0x40) <= uVar11;
          if (bVar18) {
            iVar15 = (int)pNVar1->last_amp;
            iVar9 = (int)pNVar1->wave_pos;
            do {
              iVar8 = (uint)(byte)(this->synth).impulses[uVar13 * 4 + -0x31] + iVar9;
              iVar14 = (this->reg[iVar8 >> 1] >> ((char)iVar8 * '\x04' & 4U) & 0xf) * (bVar3 & 0xf);
              iVar8 = iVar14 - iVar15;
              if (iVar8 != 0) {
                iVar8 = iVar8 * (this->synth).impl.delta_factor;
                pbVar6 = pBVar5->buffer_;
                uVar16 = (ulong)(uVar12 >> 0x10);
                uVar10 = (ulong)(uVar12 >> 9 & 0x7e);
                pbVar6[uVar16 + 2] =
                     pbVar6[uVar16 + 2] + *(short *)((long)this + (0x1f0 - uVar10)) * iVar8;
                pbVar6[uVar16 + 3] =
                     pbVar6[uVar16 + 3] + *(short *)((long)this + (0x270 - uVar10)) * iVar8;
                pbVar6[uVar16 + 4] =
                     pbVar6[uVar16 + 4] + *(short *)((long)this + (0x2f0 - uVar10)) * iVar8;
                pbVar6[uVar16 + 5] =
                     pbVar6[uVar16 + 5] + *(short *)((long)this + (0x370 - uVar10)) * iVar8;
                pbVar6[uVar16 + 6] =
                     pbVar6[uVar16 + 6] + *(short *)((long)this + (0x3f0 - uVar10)) * iVar8;
                pbVar6[uVar16 + 7] =
                     pbVar6[uVar16 + 7] + *(short *)((long)this + (0x470 - uVar10)) * iVar8;
                pbVar6[uVar16 + 8] =
                     pbVar6[uVar16 + 8] +
                     *(short *)((long)(this->synth).impulses + uVar10 + 0x280) * iVar8;
                pbVar6[uVar16 + 9] =
                     pbVar6[uVar16 + 9] +
                     *(short *)((long)(this->synth).impulses + uVar10 + 0x200) * iVar8;
                pbVar6[uVar16 + 10] =
                     pbVar6[uVar16 + 10] +
                     *(short *)((long)(this->synth).impulses + uVar10 + 0x180) * iVar8;
                pbVar6[uVar16 + 0xb] =
                     pbVar6[uVar16 + 0xb] +
                     *(short *)((long)(this->synth).impulses + uVar10 + 0x100) * iVar8;
                pbVar6[uVar16 + 0xc] =
                     pbVar6[uVar16 + 0xc] +
                     *(short *)((long)(this->synth).impulses + uVar10 + 0x80) * iVar8;
                pbVar6[uVar16 + 0xd] =
                     pbVar6[uVar16 + 0xd] +
                     *(short *)((long)(this->synth).impulses + uVar10) * iVar8;
                iVar15 = iVar14;
              }
              iVar9 = iVar9 + 1;
              uVar12 = uVar12 + ((bVar4 * 0xf0000) / uVar11) * iVar7;
              if ((int)(uint)(byte)(0x20 - (bVar2 & 0x1c)) <= iVar9) {
                iVar9 = 0;
              }
            } while (uVar12 < uVar17);
            pNVar1->wave_pos = (short)iVar9;
            pNVar1->last_amp = (short)iVar15;
            bVar18 = true;
          }
        }
        if (!bVar18) goto LAB_006d4fda;
      }
      pNVar1->delay = uVar12 - uVar17;
    }
LAB_006d4fda:
    uVar13 = uVar13 + 1;
    if ((int)uVar13 == 8) {
      this->last_time = nes_end_time;
      return;
    }
  } while( true );
}

Assistant:

void Nes_Namco_Apu::run_until( blip_time_t nes_end_time )
{
	int active_oscs = (reg [0x7F] >> 4 & 7) + 1;
	for ( int i = osc_count - active_oscs; i < osc_count; i++ )
	{
		Namco_Osc& osc = oscs [i];
		Blip_Buffer* output = osc.output;
		if ( !output )
			continue;
		output->set_modified();
		
		blip_resampled_time_t time =
				output->resampled_time( last_time ) + osc.delay;
		blip_resampled_time_t end_time = output->resampled_time( nes_end_time );
		osc.delay = 0;
		if ( time < end_time )
		{
			const BOOST::uint8_t* osc_reg = &reg [i * 8 + 0x40];
			if ( !(osc_reg [4] & 0xE0) )
				continue;
			
			int volume = osc_reg [7] & 15;
			if ( !volume )
				continue;
			
			blargg_long freq = (osc_reg [4] & 3) * 0x10000 + osc_reg [2] * 0x100L + osc_reg [0];
			if ( freq < 64 * active_oscs )
				continue; // prevent low frequencies from excessively delaying freq changes
			blip_resampled_time_t period =
					output->resampled_duration( 983040 ) / freq * active_oscs;
			
			int wave_size = 32 - (osc_reg [4] >> 2 & 7) * 4;
			if ( !wave_size )
				continue;
			
			int last_amp = osc.last_amp;
			int wave_pos = osc.wave_pos;
			
			do
			{
				// read wave sample
				int addr = wave_pos + osc_reg [6];
				int sample = reg [addr >> 1] >> (addr << 2 & 4);
				wave_pos++;
				sample = (sample & 15) * volume;
				
				// output impulse if amplitude changed
				int delta = sample - last_amp;
				if ( delta )
				{
					last_amp = sample;
					synth.offset_resampled( time, delta, output );
				}
				
				// next sample
				time += period;
				if ( wave_pos >= wave_size )
					wave_pos = 0;
			}
			while ( time < end_time );
			
			osc.wave_pos = wave_pos;
			osc.last_amp = last_amp;
		}
		osc.delay = time - end_time;
	}
	
	last_time = nes_end_time;
}